

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O2

Response * __thiscall
iqxmlrpc::Client_base::execute
          (Response *__return_storage_ptr__,Client_base *this,string *method,Param_list *pl,
          XHeaders *xheaders)

{
  Client_connection *pCVar1;
  Impl *pIVar2;
  Auto_conn conn;
  Request req;
  Auto_conn local_70;
  Request local_58;
  
  Request::Request(&local_58,method,pl);
  Auto_conn::Auto_conn(&local_70,(this->impl_).px,this);
  pCVar1 = local_70.conn_ptr_;
  pIVar2 = boost::scoped_ptr<iqxmlrpc::Client_base::Impl>::operator->(&this->impl_);
  pCVar1->options = &pIVar2->opts;
  Client_connection::process_session(__return_storage_ptr__,local_70.conn_ptr_,&local_58,xheaders);
  Auto_conn::~Auto_conn(&local_70);
  Request::~Request(&local_58);
  return __return_storage_ptr__;
}

Assistant:

Response Client_base::execute(
  const std::string& method, const Param_list& pl, const XHeaders& xheaders )
{
  Request req( method, pl );

  Auto_conn conn( *impl_.get(), *this );
  conn->set_options(impl_->opts);

  return conn->process_session( req, xheaders );
}